

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::Reader::readToken(Reader *this,Token *token)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint uVar6;
  long lVar7;
  
  pbVar2 = (byte *)this->end_;
  pbVar4 = (byte *)this->current_;
  while (((pbVar4 != pbVar2 && ((ulong)*pbVar4 < 0x21)) &&
         ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0))) {
    pbVar4 = pbVar4 + 1;
    this->current_ = (Location)pbVar4;
  }
  token->start_ = (Location)pbVar4;
  if (pbVar4 == pbVar2) {
LAB_001091d7:
    token->type_ = tokenEndOfStream;
    goto LAB_0010924d;
  }
  pbVar5 = pbVar4 + 1;
  this->current_ = (Location)pbVar5;
  bVar1 = *pbVar4;
  if (0x5a < bVar1) {
    if (bVar1 < 0x6e) {
      if (bVar1 == 0x5b) {
        token->type_ = tokenArrayBegin;
        goto LAB_0010924d;
      }
      if (bVar1 == 0x5d) {
        token->type_ = tokenArrayEnd;
        goto LAB_0010924d;
      }
      if ((bVar1 == 0x66) && (token->type_ = tokenFalse, 3 < (long)pbVar2 - (long)pbVar5)) {
        lVar7 = 4;
        do {
          if (lVar7 == 0) {
            pbVar4 = pbVar4 + 5;
            goto LAB_00109284;
          }
          pbVar2 = pbVar4 + lVar7;
          pbVar5 = (byte *)("false" + lVar7);
          lVar7 = lVar7 + -1;
        } while (*pbVar2 == *pbVar5);
      }
    }
    else if (bVar1 < 0x7b) {
      if (bVar1 == 0x6e) {
        token->type_ = tokenNull;
        if (2 < (long)pbVar2 - (long)pbVar5) {
          lVar7 = 3;
          do {
            if (lVar7 == 0) goto LAB_0010927a;
            pbVar2 = pbVar4 + lVar7;
            pbVar5 = (byte *)("null" + lVar7);
            lVar7 = lVar7 + -1;
          } while (*pbVar2 == *pbVar5);
        }
      }
      else if ((bVar1 == 0x74) && (token->type_ = tokenTrue, 2 < (long)pbVar2 - (long)pbVar5)) {
        lVar7 = 3;
        do {
          if (lVar7 == 0) goto LAB_0010927a;
          pbVar2 = pbVar4 + lVar7;
          pbVar5 = (byte *)("true" + lVar7);
          lVar7 = lVar7 + -1;
        } while (*pbVar2 == *pbVar5);
      }
    }
    else {
      if (bVar1 == 0x7d) {
        token->type_ = tokenObjectEnd;
        goto LAB_0010924d;
      }
      if (bVar1 == 0x7b) {
        token->type_ = tokenObjectBegin;
        goto LAB_0010924d;
      }
    }
    goto switchD_001090af_caseD_23;
  }
  switch(bVar1) {
  case 0x22:
    token->type_ = tokenString;
    bVar3 = readString(this);
    goto LAB_001091fd;
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2e:
    break;
  case 0x2c:
    token->type_ = tokenArraySeparator;
    goto LAB_0010924d;
  case 0x2d:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    token->type_ = tokenNumber;
    while ((pbVar5 != pbVar2 &&
           (((byte)(*pbVar5 - 0x30) < 10 ||
            ((uVar6 = *pbVar5 - 0x2b, uVar6 < 0x3b &&
             ((0x40000000400000dU >> ((ulong)uVar6 & 0x3f) & 1) != 0))))))) {
      pbVar5 = pbVar5 + 1;
      this->current_ = (Location)pbVar5;
    }
    goto LAB_0010924d;
  case 0x2f:
    token->type_ = tokenComment;
    bVar3 = readComment(this);
LAB_001091fd:
    if (bVar3 != false) goto LAB_0010924d;
    break;
  case 0x3a:
    token->type_ = tokenMemberSeparator;
    goto LAB_0010924d;
  default:
    if (bVar1 == 0) goto LAB_001091d7;
  }
switchD_001090af_caseD_23:
  token->type_ = tokenError;
LAB_0010924d:
  token->end_ = this->current_;
  return true;
LAB_0010927a:
  pbVar4 = pbVar4 + 4;
LAB_00109284:
  this->current_ = (Location)pbVar4;
  goto LAB_0010924d;
}

Assistant:

bool Reader::readToken(Token& token) {
  skipSpaces();
  token.start_ = current_;
  Char c = getNextChar();
  bool ok = true;
  switch (c) {
  case '{':
    token.type_ = tokenObjectBegin;
    break;
  case '}':
    token.type_ = tokenObjectEnd;
    break;
  case '[':
    token.type_ = tokenArrayBegin;
    break;
  case ']':
    token.type_ = tokenArrayEnd;
    break;
  case '"':
    token.type_ = tokenString;
    ok = readString();
    break;
  case '/':
    token.type_ = tokenComment;
    ok = readComment();
    break;
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
  case '-':
    token.type_ = tokenNumber;
    readNumber();
    break;
  case 't':
    token.type_ = tokenTrue;
    ok = match("rue", 3);
    break;
  case 'f':
    token.type_ = tokenFalse;
    ok = match("alse", 4);
    break;
  case 'n':
    token.type_ = tokenNull;
    ok = match("ull", 3);
    break;
  case ',':
    token.type_ = tokenArraySeparator;
    break;
  case ':':
    token.type_ = tokenMemberSeparator;
    break;
  case 0:
    token.type_ = tokenEndOfStream;
    break;
  default:
    ok = false;
    break;
  }
  if (!ok)
    token.type_ = tokenError;
  token.end_ = current_;
  return true;
}